

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
               (string_t *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  idx_t iVar1;
  idx_t iVar2;
  int64_t *piVar3;
  string_t input;
  string_t input_00;
  hugeint_t hVar4;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar3 = &result_data->upper;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      iVar1 = iVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[iVar2];
      }
      input_00.value.pointer.ptr = ldata[iVar1].value.pointer.ptr;
      input_00.value._0_8_ = *(undefined8 *)&ldata[iVar1].value;
      hVar4 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
              Operation<duckdb::string_t,duckdb::hugeint_t>(input_00,result_mask,iVar2,dataptr);
      ((hugeint_t *)(piVar3 + -1))->lower = hVar4.lower;
      *piVar3 = hVar4.upper;
      piVar3 = piVar3 + 2;
    }
  }
  else {
    piVar3 = &result_data->upper;
    for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
      iVar1 = iVar2;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)sel_vector->sel_vector[iVar2];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar1 >> 6] >>
           (iVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,iVar2);
      }
      else {
        input.value.pointer.ptr = ldata[iVar1].value.pointer.ptr;
        input.value._0_8_ = *(undefined8 *)&ldata[iVar1].value;
        hVar4 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
                Operation<duckdb::string_t,duckdb::hugeint_t>(input,result_mask,iVar2,dataptr);
        ((hugeint_t *)(piVar3 + -1))->lower = hVar4.lower;
        *piVar3 = hVar4.upper;
      }
      piVar3 = piVar3 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}